

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode resolve_server(Curl_easy *data,connectdata *conn,_Bool *async)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  timediff_t timeoutms;
  char *hostname;
  long lVar4;
  CURLcode CVar5;
  Curl_dns_entry *hostaddr;
  Curl_dns_entry *local_40;
  _Bool *local_38;
  
  timeoutms = Curl_timeleft(data,(curltime *)0x0,true);
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar1 & 2) != 0) {
    *async = false;
    return CURLE_OK;
  }
  local_38 = async;
  if ((uVar1 & 0x10) == 0) {
    lVar4 = 0xf0;
    if ((uVar1 & 4) == 0) {
      lVar4 = 0xc0;
    }
    conn->port = (long)*(int *)(conn->primary_ip + ((ulong)((uVar1 & 8) >> 1) - 10));
    hostname = (*Curl_cstrdup)(*(char **)((conn->chunk).hexbuffer + lVar4 + -0x10));
    conn->hostname_resolve = hostname;
    CVar5 = CURLE_OK;
    if (hostname == (char *)0x0) goto LAB_004c78ea;
    iVar3 = Curl_resolv_timeout(conn,hostname,(int)conn->port,&local_40,timeoutms);
    if (iVar3 == -2) {
LAB_004c78b7:
      CVar5 = CURLE_OPERATION_TIMEDOUT;
      goto LAB_004c78ea;
    }
    if (iVar3 != 1) {
      CVar5 = CURLE_OK;
      if (local_40 == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Couldn\'t resolve host \'%s\'",
                   *(undefined8 *)((conn->chunk).hexbuffer + lVar4 + -8));
        CVar5 = CURLE_COULDNT_RESOLVE_HOST;
      }
      goto LAB_004c78ea;
    }
  }
  else {
    uVar2 = (ulong)((uVar1 & 0x40) == 0);
    hostname = (*Curl_cstrdup)((&conn->socks_proxy)[uVar2].host.name);
    conn->hostname_resolve = hostname;
    CVar5 = CURLE_OK;
    if (hostname == (char *)0x0) goto LAB_004c78ea;
    iVar3 = Curl_resolv_timeout(conn,hostname,(int)conn->port,&local_40,timeoutms);
    if (iVar3 == -2) goto LAB_004c78b7;
    if (iVar3 != 1) {
      if (local_40 == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
                   *(undefined8 *)((conn->chunk).hexbuffer + ((uVar2 * 0x40 | 0x110) - 8)));
        CVar5 = CURLE_COULDNT_RESOLVE_PROXY;
      }
      goto LAB_004c78ea;
    }
  }
  CVar5 = CURLE_OK;
  *local_38 = true;
LAB_004c78ea:
  if (hostname == (char *)0x0) {
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  else {
    conn->dns_entry = local_40;
  }
  return CVar5;
}

Assistant:

static CURLcode resolve_server(struct Curl_easy *data,
                               struct connectdata *conn,
                               bool *async)
{
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

  DEBUGASSERT(conn);
  DEBUGASSERT(data);
  /*************************************************************
   * Resolve the name of the server or proxy
   *************************************************************/
  if(conn->bits.reuse)
    /* We're reusing the connection - no need to resolve anything, and
       idnconvert_hostname() was called already in create_conn() for the re-use
       case. */
    *async = FALSE;

  else {
    /* this is a fresh connect */
    int rc;
    struct Curl_dns_entry *hostaddr;

#ifdef USE_UNIX_SOCKETS
    if(conn->unix_domain_socket) {
      /* Unix domain sockets are local. The host gets ignored, just use the
       * specified domain socket address. Do not cache "DNS entries". There is
       * no DNS involved and we already have the filesystem path available */
      const char *path = conn->unix_domain_socket;

      hostaddr = calloc(1, sizeof(struct Curl_dns_entry));
      if(!hostaddr)
        result = CURLE_OUT_OF_MEMORY;
      else {
        bool longpath = FALSE;
        hostaddr->addr = Curl_unix2addr(path, &longpath,
                                        conn->abstract_unix_socket);
        if(hostaddr->addr)
          hostaddr->inuse++;
        else {
          /* Long paths are not supported for now */
          if(longpath) {
            failf(data, "Unix socket path too long: '%s'", path);
            result = CURLE_COULDNT_RESOLVE_HOST;
          }
          else
            result = CURLE_OUT_OF_MEMORY;
          free(hostaddr);
          hostaddr = NULL;
        }
      }
    }
    else
#endif
    if(!conn->bits.proxy) {
      struct hostname *connhost;
      if(conn->bits.conn_to_host)
        connhost = &conn->conn_to_host;
      else
        connhost = &conn->host;

      /* If not connecting via a proxy, extract the port from the URL, if it is
       * there, thus overriding any defaults that might have been set above. */
      if(conn->bits.conn_to_port)
        conn->port = conn->conn_to_port;
      else
        conn->port = conn->remote_port;

      /* Resolve target host right on */
      conn->hostname_resolve = strdup(connhost->name);
      if(!conn->hostname_resolve)
        return CURLE_OUT_OF_MEMORY;
      rc = Curl_resolv_timeout(conn, conn->hostname_resolve, (int)conn->port,
                               &hostaddr, timeout_ms);
      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve host '%s'", connhost->dispname);
        result =  CURLE_COULDNT_RESOLVE_HOST;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    else {
      /* This is a proxy that hasn't been resolved yet. */

      struct hostname * const host = conn->bits.socksproxy ?
        &conn->socks_proxy.host : &conn->http_proxy.host;

      /* resolve proxy */
      conn->hostname_resolve = strdup(host->name);
      if(!conn->hostname_resolve)
        return CURLE_OUT_OF_MEMORY;
      rc = Curl_resolv_timeout(conn, conn->hostname_resolve, (int)conn->port,
                               &hostaddr, timeout_ms);

      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve proxy '%s'", host->dispname);
        result = CURLE_COULDNT_RESOLVE_PROXY;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    DEBUGASSERT(conn->dns_entry == NULL);
    conn->dns_entry = hostaddr;
  }

  return result;
}